

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_()>::UntypedPerformAction
          (FunctionMockerBase<void_()> *this,void *untyped_action,void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  Action<void_()> action;
  linked_ptr<testing::ActionInterface<void_()>_> local_20;
  
  linked_ptr<testing::ActionInterface<void_()>_>::linked_ptr
            (&local_20,(linked_ptr<testing::ActionInterface<void_()>_> *)untyped_action);
  pUVar1 = &ActionResultHolder<void>::PerformAction<void()>
                      ((Action<void_()> *)&local_20,(ArgumentTuple *)untyped_args)->
            super_UntypedActionResultHolderBase;
  linked_ptr<testing::ActionInterface<void_()>_>::~linked_ptr(&local_20);
  return pUVar1;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }